

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QLoggingRule>::emplace<QLoggingRule>
          (QMovableArrayOps<QLoggingRule> *this,qsizetype i,QLoggingRule *args)

{
  bool bVar1;
  qsizetype qVar2;
  QLoggingRule *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QLoggingRule tmp;
  QLoggingRule *in_stack_ffffffffffffff58;
  Inserter *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar3;
  GrowthPosition in_stack_ffffffffffffff7c;
  QArrayDataPointer<QLoggingRule> *in_stack_ffffffffffffff80;
  Inserter local_58;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QLoggingRule>::needsDetach
                    ((QArrayDataPointer<QLoggingRule> *)in_stack_ffffffffffffff60);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<QLoggingRule>::freeSpaceAtEnd
                          ((QArrayDataPointer<QLoggingRule> *)
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
       qVar2 != 0)) {
      QArrayDataPointer<QLoggingRule>::end
                ((QArrayDataPointer<QLoggingRule> *)in_stack_ffffffffffffff60);
      QLoggingRule::QLoggingRule
                ((QLoggingRule *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      in_RDI->displaceTo = (QLoggingRule *)((long)&(in_RDI->displaceTo->category).d.d + 1);
      goto LAB_002d89e9;
    }
    if ((in_RSI == (QLoggingRule *)0x0) &&
       (qVar2 = QArrayDataPointer<QLoggingRule>::freeSpaceAtBegin
                          ((QArrayDataPointer<QLoggingRule> *)
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
       qVar2 != 0)) {
      QArrayDataPointer<QLoggingRule>::begin((QArrayDataPointer<QLoggingRule> *)0x2d888a);
      QLoggingRule::QLoggingRule
                ((QLoggingRule *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QLoggingRule *)((long)&(in_RDI->displaceTo->category).d.d + 1);
      goto LAB_002d89e9;
    }
  }
  memset(local_30,0xaa,0x28);
  QLoggingRule::QLoggingRule((QLoggingRule *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  bVar1 = in_RDI->displaceTo != (QLoggingRule *)0x0;
  uVar3 = bVar1 && in_RSI == (QLoggingRule *)0x0;
  QArrayDataPointer<QLoggingRule>::detachAndGrow
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(qsizetype)in_RDI,
             (QLoggingRule **)CONCAT17(uVar3,in_stack_ffffffffffffff68),
             (QArrayDataPointer<QLoggingRule> *)in_stack_ffffffffffffff60);
  if (bVar1 && in_RSI == (QLoggingRule *)0x0) {
    QArrayDataPointer<QLoggingRule>::begin((QArrayDataPointer<QLoggingRule> *)0x2d8945);
    QLoggingRule::QLoggingRule((QLoggingRule *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QLoggingRule *)((long)&(in_RDI->displaceTo->category).d.d + 1);
  }
  else {
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QLoggingRule> *)
                              CONCAT17(uVar3,in_stack_ffffffffffffff68),
                       (qsizetype)in_stack_ffffffffffffff60,(qsizetype)in_stack_ffffffffffffff58);
    Inserter::insertOne(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Inserter::~Inserter(&local_58);
  }
  QLoggingRule::~QLoggingRule((QLoggingRule *)0x2d89e9);
LAB_002d89e9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }